

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclSize.c
# Opt level: O2

void Abc_SclTimeCone(SC_Man *p,Vec_Int_t *vCone)

{
  uint uVar1;
  Abc_Ntk_t *pAVar2;
  SC_Pair *pSVar3;
  int iVar4;
  Abc_Obj_t *pAVar5;
  int i;
  int iVar6;
  
  for (iVar6 = 0; iVar4 = vCone->nSize, iVar6 < iVar4; iVar6 = iVar6 + 1) {
    pAVar2 = p->pNtk;
    iVar4 = Vec_IntEntry(vCone,iVar6);
    pAVar5 = Abc_NtkObj(pAVar2,iVar4);
    if (pAVar5 != (Abc_Obj_t *)0x0) {
      pSVar3 = p->pTimes;
      uVar1 = pAVar5->Id;
      pSVar3[uVar1].rise = 0.0;
      pSVar3[uVar1].fall = 0.0;
      pSVar3 = p->pSlews;
      uVar1 = pAVar5->Id;
      pSVar3[uVar1].rise = 0.0;
      pSVar3[uVar1].fall = 0.0;
    }
  }
  for (iVar6 = 0; iVar6 < iVar4; iVar6 = iVar6 + 1) {
    pAVar2 = p->pNtk;
    iVar4 = Vec_IntEntry(vCone,iVar6);
    pAVar5 = Abc_NtkObj(pAVar2,iVar4);
    if (pAVar5 != (Abc_Obj_t *)0x0) {
      Abc_SclTimeNode(p,pAVar5,0);
    }
    iVar4 = vCone->nSize;
  }
  return;
}

Assistant:

void Abc_SclTimeCone( SC_Man * p, Vec_Int_t * vCone )
{
    int fVerbose = 0;
    Abc_Obj_t * pObj;
    int i;
    Abc_SclConeClean( p, vCone );
    Abc_NtkForEachObjVec( vCone, p->pNtk, pObj, i )
    {
        if ( fVerbose && Abc_ObjIsNode(pObj) )
        printf( "  Updating node %d with gate %s\n", Abc_ObjId(pObj), Abc_SclObjCell(pObj)->pName );
        if ( fVerbose && Abc_ObjIsNode(pObj) )
        printf( "    before (%6.1f ps  %6.1f ps)   ", Abc_SclObjTimeOne(p, pObj, 1), Abc_SclObjTimeOne(p, pObj, 0) );
        Abc_SclTimeNode( p, pObj, 0 );
        if ( fVerbose && Abc_ObjIsNode(pObj) )
        printf( "after (%6.1f ps  %6.1f ps)\n", Abc_SclObjTimeOne(p, pObj, 1), Abc_SclObjTimeOne(p, pObj, 0) );
    }
}